

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::find(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  byte bVar1;
  uint uVar2;
  Xt Value;
  Definition *pDVar3;
  
  requireDStackDepth(this,1,"FIND");
  requireDStackAvailable(this,1,"FIND");
  this_00 = &this->dStack;
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  bVar1 = dataSpaceAt(this,uVar2);
  Value = findDefinition(this,uVar2 + 1,(uint)bVar1);
  if (Value == 0) {
    uVar2 = 0;
  }
  else {
    ForthStack<unsigned_int>::setTop(this_00,Value);
    pDVar3 = definitionsAt(this,Value);
    uVar2 = -(uint)((pDVar3->FlagImmediate & pDVar3->flags) == 0) | 1;
  }
  ForthStack<unsigned_int>::push(this_00,uVar2);
  return;
}

Assistant:

void find() {
			REQUIRE_DSTACK_DEPTH(1, "FIND");
			REQUIRE_DSTACK_AVAILABLE(1, "FIND");
			auto caddr = CADDR(dStack.getTop());
			auto length = static_cast<Cell>(getDataChar(caddr));
			auto name = caddr + 1;
			auto word = findDefinition(name, length);
			if (word == 0) {
				push(0);
			}
			else {
				dStack.setTop(CELL(word));
				push(definitionsAt(word).isImmediate() ? 1 : Cell(-1));
			}
		}